

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O3

char * dtl_sv_to_cstr(dtl_sv_t *self,_Bool *ok)

{
  uint uVar1;
  adt_str_t *paVar2;
  char *pcVar3;
  
  if (self != (dtl_sv_t *)0x0) {
    if (ok != (_Bool *)0x0) {
      *ok = false;
    }
    uVar1 = self->u32Flags >> 4 & 0xf;
    if (uVar1 - 1 < 7) {
      paVar2 = self->pAny->tmpStr;
      if (paVar2 == (adt_str_t *)0x0) {
        paVar2 = adt_str_new();
        self->pAny->tmpStr = paVar2;
      }
      else {
        adt_str_clear(paVar2);
        paVar2 = self->pAny->tmpStr;
      }
      if (paVar2 != (adt_str_t *)0x0) {
        dtl_sv_to_string_internal(self,paVar2,ok);
        paVar2 = self->pAny->tmpStr;
LAB_0013d8b2:
        pcVar3 = adt_str_cstr(paVar2);
        return pcVar3;
      }
    }
    else {
      if (uVar1 == 8) {
        if (ok != (_Bool *)0x0) {
          *ok = true;
        }
        if ((self->pAny->val).cr == '\0') {
          return "false";
        }
        return "true";
      }
      if (uVar1 == 9) {
        if (ok != (_Bool *)0x0) {
          *ok = true;
        }
        paVar2 = (self->pAny->val).str;
        goto LAB_0013d8b2;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char* dtl_sv_to_cstr(dtl_sv_t *self, bool* ok){
   if(self != NULL)
   {
      if (ok != NULL) *ok = false;
      switch(dtl_sv_type(self)){
      case DTL_SV_NONE:
         break;
      case DTL_SV_I32:
      case DTL_SV_U32:
      case DTL_SV_I64:
      case DTL_SV_U64:
      case DTL_SV_FLT:
      case DTL_SV_DBL:
      case DTL_SV_CHAR:
         if (self->pAny->tmpStr == NULL)
         {
            self->pAny->tmpStr = adt_str_new();
         }
         else
         {
            adt_str_clear(self->pAny->tmpStr);
         }
         if (self->pAny->tmpStr != 0)
         {
            dtl_sv_to_string_internal(self, self->pAny->tmpStr, ok);
            return adt_str_cstr(self->pAny->tmpStr);
         }
         break;
      case DTL_SV_BOOL:
         if (ok != NULL) *ok = true;
         return self->pAny->val.bl? "true" : "false";
      case DTL_SV_STR:
         if (ok != NULL) *ok = true;
         return adt_str_cstr(self->pAny->val.str);
      case DTL_SV_PTR:
         break;
      case DTL_SV_DV:
         break;
      case DTL_SV_BYTES:
         break;
      case DTL_SV_BYTEARRAY:
         break;
      }
   }
   return NULL;
}